

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrixUtil.hpp
# Opt level: O0

Matrix<float,_2,_2> __thiscall tcu::transpose<float,2,2>(tcu *this,Matrix<float,_2,_2> *mat)

{
  float fVar1;
  float *pfVar2;
  float extraout_XMM0_Qa [2];
  Vector<float,_2> VVar3;
  Vector<float,_2> in_XMM1_Qa;
  Matrix<float,_2,_2> MVar4;
  undefined4 local_24;
  undefined4 local_20;
  int col;
  int row;
  Matrix<float,_2,_2> *mat_local;
  Matrix<float,_2,_2> *res;
  
  Matrix<float,_2,_2>::Matrix((Matrix<float,_2,_2> *)this);
  VVar3.m_data = extraout_XMM0_Qa;
  for (local_20 = 0; local_20 < 2; local_20 = local_20 + 1) {
    for (local_24 = 0; local_24 < 2; local_24 = local_24 + 1) {
      pfVar2 = Matrix<float,_2,_2>::operator()(mat,local_20,local_24);
      fVar1 = *pfVar2;
      pfVar2 = Matrix<float,_2,_2>::operator()((Matrix<float,_2,_2> *)this,local_24,local_20);
      VVar3.m_data[1] = 0.0;
      VVar3.m_data[0] = fVar1;
      *pfVar2 = fVar1;
    }
  }
  MVar4.m_data.m_data[1].m_data[0] = in_XMM1_Qa.m_data[0];
  MVar4.m_data.m_data[1].m_data[1] = in_XMM1_Qa.m_data[1];
  MVar4.m_data.m_data[0].m_data[0] = VVar3.m_data[0];
  MVar4.m_data.m_data[0].m_data[1] = VVar3.m_data[1];
  return (Matrix<float,_2,_2>)MVar4.m_data.m_data;
}

Assistant:

inline Matrix<T, Cols, Rows> transpose (const Matrix<T, Rows, Cols>& mat)
{
	Matrix<T, Cols, Rows> res;
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			res(col, row) = mat(row, col);
	return res;
}